

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_str.c
# Opt level: O3

char * tr_str(TestResult *tr)

{
  uint uVar1;
  char *pcVar2;
  char *pcVar3;
  
  if (tr->ctx == CK_CTX_TEST) {
    uVar1 = tr->rtype - CK_PASS;
    if (uVar1 < 3) {
      pcVar2 = &DAT_00107d8c + *(int *)(&DAT_00107d8c + (ulong)uVar1 * 4);
    }
    else {
      pcVar2 = (char *)0x0;
    }
  }
  else {
    pcVar2 = "S";
  }
  pcVar3 = "";
  if (tr->rtype == CK_ERROR) {
    pcVar3 = "(after this point) ";
  }
  pcVar2 = ck_strdup_printf("%s:%d:%s:%s:%s:%d: %s%s",tr->file,(ulong)(uint)tr->line,pcVar2,
                            tr->tcname,tr->tname,(ulong)(uint)tr->iter,pcVar3,tr->msg);
  return pcVar2;
}

Assistant:

char *tr_str(TestResult * tr)
{
    const char *exact_msg;
    char *rstr;

    exact_msg = (tr->rtype == CK_ERROR) ? "(after this point) " : "";

    rstr = ck_strdup_printf("%s:%d:%s:%s:%s:%d: %s%s",
                            tr->file, tr->line,
                            tr_type_str(tr), tr->tcname, tr->tname, tr->iter,
                            exact_msg, tr->msg);

    return rstr;
}